

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O1

bool Diligent::PipelineResourceLayoutDesc::IsEqual
               (PipelineResourceLayoutDesc *Desc1,PipelineResourceLayoutDesc *Desc2,
               bool IgnoreVariables,bool IgnoreSamplers)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if (Desc1->DefaultVariableType != Desc2->DefaultVariableType) {
    return false;
  }
  if (((Desc1->DefaultVariableMergeStages == Desc2->DefaultVariableMergeStages) &&
      (Desc1->NumVariables == Desc2->NumVariables)) &&
     (Desc1->NumImmutableSamplers == Desc2->NumImmutableSamplers)) {
    if ((!IgnoreVariables) && (bVar4 = Desc1->NumVariables != 0, bVar4)) {
      bVar1 = ShaderResourceVariableDesc::operator==(Desc1->Variables,Desc2->Variables);
      if (bVar1) {
        uVar3 = 0;
        lVar2 = 0x10;
        do {
          uVar3 = uVar3 + 1;
          bVar4 = uVar3 < Desc1->NumVariables;
          if (!bVar4) goto LAB_0016bc49;
          bVar1 = ShaderResourceVariableDesc::operator==
                            ((ShaderResourceVariableDesc *)((long)&Desc1->Variables->Name + lVar2),
                             (ShaderResourceVariableDesc *)((long)&Desc2->Variables->Name + lVar2));
          lVar2 = lVar2 + 0x10;
        } while (bVar1);
      }
      if (bVar4) goto LAB_0016bca2;
    }
LAB_0016bc49:
    if ((!IgnoreSamplers) && (bVar4 = Desc1->NumImmutableSamplers != 0, bVar4)) {
      bVar1 = ImmutableSamplerDesc::operator==(Desc1->ImmutableSamplers,Desc2->ImmutableSamplers);
      if (bVar1) {
        uVar3 = 0;
        lVar2 = 0x48;
        do {
          uVar3 = uVar3 + 1;
          bVar4 = uVar3 < Desc1->NumImmutableSamplers;
          if (!bVar4) goto LAB_0016bcb6;
          bVar1 = ImmutableSamplerDesc::operator==
                            ((ImmutableSamplerDesc *)
                             ((long)(Desc1->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x2c),
                             (ImmutableSamplerDesc *)
                             ((long)(Desc2->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x2c));
          lVar2 = lVar2 + 0x48;
        } while (bVar1);
      }
      if (bVar4) goto LAB_0016bca2;
    }
LAB_0016bcb6:
    bVar4 = true;
  }
  else {
LAB_0016bca2:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool IsEqual(const PipelineResourceLayoutDesc& Desc1,
                        const PipelineResourceLayoutDesc& Desc2,
                        bool                              IgnoreVariables = false,
                        bool                              IgnoreSamplers  = false)
    {
        if (!(Desc1.DefaultVariableType        == Desc2.DefaultVariableType        &&
              Desc1.DefaultVariableMergeStages == Desc2.DefaultVariableMergeStages &&
              Desc1.NumVariables               == Desc2.NumVariables               &&
              Desc1.NumImmutableSamplers       == Desc2.NumImmutableSamplers))
           return false;

        if (!IgnoreVariables)
        {
            for (Uint32 i = 0; i < Desc1.NumVariables; ++i)
                if (Desc1.Variables[i] != Desc2.Variables[i])
                    return false;
        }

        if (!IgnoreSamplers)
        {
            for (Uint32 i = 0; i < Desc1.NumImmutableSamplers; ++i)
                if (Desc1.ImmutableSamplers[i] != Desc2.ImmutableSamplers[i])
                    return false;
        }

        return true;
    }